

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                  *this,int opcode)

{
  Kind KVar1;
  BinaryReader<mp::internal::IdentityConverter> *pBVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  AssertionFailure *this_00;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  local_28.field_1.values_ = (Value *)&local_38;
  if (0x52 < (uint)opcode) {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid opcode");
LAB_001c3dbc:
    __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  KVar1 = OpCodeInfo::INFO[(uint)opcode].first_kind;
  if ((int)KVar1 < 0x3b) {
    if (KVar1 != NOT) {
      if (KVar1 != FIRST_BINARY_LOGICAL) {
        if (KVar1 == FIRST_RELATIONAL) {
          pBVar2 = this->reader_;
          pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
          (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
          (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
          ReadNumericExpr(this,*pcVar3,false);
          pBVar2 = this->reader_;
          pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
          (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
          (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
          ReadNumericExpr(this,*pcVar3,false);
          return (LogicalExpr)NULL_ID;
        }
        goto switchD_001c3c67_caseD_3c;
      }
      goto LAB_001c3d64;
    }
LAB_001c3d6c:
    ReadLogicalExpr(this);
  }
  else {
    switch(KVar1) {
    case ATLEAST:
      pBVar2 = this->reader_;
      pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      ReadNumericExpr(this,*pcVar3,false);
      pBVar2 = this->reader_;
      pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      if (*pcVar3 == 'o') {
        uVar4 = ReadOpCode(this);
        if (0x52 < uVar4) {
          this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
          AssertionFailure::AssertionFailure(this_00,"invalid opcode");
          goto LAB_001c3dbc;
        }
        if (OpCodeInfo::INFO[uVar4].kind == COUNT) {
          ReadCountExpr(this);
          return (LogicalExpr)NULL_ID;
        }
      }
      local_38 = 0;
      uStack_30 = 0;
      local_28.types_ = 0;
      local_28.field_1.values_ = (Value *)&local_38;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x2637d2,&local_28);
    default:
switchD_001c3c67_caseD_3c:
      local_38 = 0;
      uStack_30 = 0;
      local_28.types_ = 0;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x265232,&local_28);
    case IMPLICATION:
      ReadLogicalExpr(this);
LAB_001c3d64:
      ReadLogicalExpr(this);
      goto LAB_001c3d6c;
    case EXISTS:
      iVar5 = ReadNumArgs(this,3);
      if (0 < iVar5) {
        do {
          ReadLogicalExpr(this);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      break;
    case ALLDIFF:
      iVar5 = ReadNumArgs(this,1);
      if (0 < iVar5) {
        do {
          pBVar2 = this->reader_;
          pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
          (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
          (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
          ReadNumericExpr(this,*pcVar3,false);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
    }
  }
  return (LogicalExpr)NULL_ID;
}

Assistant:

fmt::StringRef ReadString() {
    int length = ReadUInt();
    return fmt::StringRef(length != 0 ? Read(length) : 0, length);
  }